

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreeKeyRoomAction.cpp
# Opt level: O1

void __thiscall
ThreeKeyRoomAction::pickUpItem(ThreeKeyRoomAction *this,itemType *item,string *information)

{
  ItemWrapper *pIVar1;
  long *plVar2;
  long *plVar3;
  long *local_58;
  long local_50;
  long local_48;
  long lStack_40;
  string local_38;
  
  pIVar1 = ItemTable::getValue((this->super_AbstractRoomAction).itemList,item);
  ItemWrapper::setLocation(pIVar1,BACKPACK);
  pIVar1 = ItemTable::getValue((this->super_AbstractRoomAction).itemList,item);
  ItemWrapper::getItemName_abi_cxx11_(&local_38,pIVar1);
  plVar2 = (long *)std::__cxx11::string::replace((ulong)&local_38,0,(char *)0x0,0x127891);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_48 = *plVar3;
    lStack_40 = plVar2[3];
    local_58 = &local_48;
  }
  else {
    local_48 = *plVar3;
    local_58 = (long *)*plVar2;
  }
  local_50 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::__cxx11::string::operator=((string *)information,(string *)&local_58);
  if (local_58 != &local_48) {
    operator_delete(local_58);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return;
}

Assistant:

void ThreeKeyRoomAction::pickUpItem(const itemType &item, std::string &information) const {
    itemList->getValue(item)->setLocation(BACKPACK);
    information = "You pick up the " + itemList->getValue(item)->getItemName();
}